

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoTableSize(Thread *this,Instr instr)

{
  Store *store;
  u32 uVar1;
  RefVec *this_00;
  const_reference pvVar2;
  Table *this_01;
  undefined1 local_28 [8];
  Ptr table;
  Thread *this_local;
  
  store = this->store_;
  table.root_index_ = (Index)this;
  this_00 = Instance::tables(this->inst_);
  pvVar2 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  RefPtr<wabt::interp::Table>::RefPtr
            ((RefPtr<wabt::interp::Table> *)local_28,store,(Ref)pvVar2->index);
  this_01 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_28);
  uVar1 = Table::size(this_01);
  PushPtr(this,(Ptr *)local_28,(ulong)uVar1);
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoTableSize(Instr instr) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  PushPtr(table, table->size());
  return RunResult::Ok;
}